

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O3

_Bool eval(ExprNode *en,char *hostname,uint port)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  _Bool _Var4;
  
  bVar2 = 0;
  for (; en->op == OP_NOT; en = (ExprNode *)(en->field_2).field_0.subexprs) {
    bVar2 = bVar2 ^ 1;
  }
  switch(en->op) {
  case OP_AND:
    if ((en->field_2).field_0.nsubexprs == 0) {
      _Var4 = true;
    }
    else {
      uVar3 = 0;
      do {
        _Var4 = eval((en->field_2).field_0.subexprs[uVar3],hostname,port);
        if (!_Var4) break;
        uVar3 = uVar3 + 1;
      } while (uVar3 < (en->field_2).field_0.nsubexprs);
    }
    goto LAB_0015d767;
  case OP_OR:
    if ((en->field_2).field_0.nsubexprs != 0) {
      uVar3 = 0;
      do {
        _Var4 = eval((en->field_2).field_0.subexprs[uVar3],hostname,port);
        if (_Var4) break;
        uVar3 = uVar3 + 1;
      } while (uVar3 < (en->field_2).field_0.nsubexprs);
      goto LAB_0015d767;
    }
    break;
  default:
    __assert_fail("false && \"unhandled node type in eval\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                  ,0x253,"_Bool eval(ExprNode *, const char *, unsigned int)");
  case OP_HOSTNAME_WC:
    iVar1 = wc_match((char *)(en->field_2).field_0.subexprs,hostname);
    _Var4 = iVar1 != 0;
    goto LAB_0015d767;
  case OP_PORT_RANGE:
    if ((en->field_2).field_3.lo <= port) {
      _Var4 = port <= (en->field_2).field_3.hi;
      goto LAB_0015d767;
    }
  }
  _Var4 = false;
LAB_0015d767:
  return (_Bool)(bVar2 ^ _Var4);
}

Assistant:

static bool eval(ExprNode *en, const char *hostname, unsigned port)
{
    switch (en->op) {
      case OP_AND:
        for (size_t i = 0; i < en->nsubexprs; i++)
            if (!eval(en->subexprs[i], hostname, port))
                return false;
        return true;

      case OP_OR:
        for (size_t i = 0; i < en->nsubexprs; i++)
            if (eval(en->subexprs[i], hostname, port))
                return true;
        return false;

      case OP_NOT:
        return !eval(en->subexpr, hostname, port);

      case OP_HOSTNAME_WC:
        return wc_match(en->wc, hostname);

      case OP_PORT_RANGE:
        return en->lo <= port && port <= en->hi;

      default:
        unreachable("unhandled node type in eval");
    }
}